

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::IsMouseHoveringRect(ImVec2 *r_min,ImVec2 *r_max,bool clip)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ImGuiWindow *pIVar4;
  ImGuiContext *g;
  undefined3 in_register_00000011;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar8 = r_min->x;
  fVar6 = r_min->y;
  fVar7 = r_max->x;
  fVar1 = r_max->y;
  fVar5 = fVar1;
  if (CONCAT31(in_register_00000011,clip) != 0) {
    pIVar4 = GImGui->CurrentWindow;
    fVar5 = (pIVar4->ClipRect).Min.x;
    fVar2 = (pIVar4->ClipRect).Min.y;
    if (fVar5 <= fVar8) {
      fVar5 = fVar8;
    }
    fVar8 = fVar5;
    if (fVar2 <= fVar6) {
      fVar2 = fVar6;
    }
    fVar6 = fVar2;
    fVar5 = (pIVar4->ClipRect).Max.x;
    if (fVar7 <= fVar5) {
      fVar5 = fVar7;
    }
    fVar7 = fVar5;
    fVar5 = (pIVar4->ClipRect).Max.y;
    if (fVar1 <= fVar5) {
      fVar5 = fVar1;
    }
  }
  fVar1 = (GImGui->Style).TouchExtraPadding.x;
  fVar2 = (GImGui->IO).MousePos.x;
  if (fVar8 - fVar1 <= fVar2) {
    fVar8 = (GImGui->Style).TouchExtraPadding.y;
    fVar3 = (GImGui->IO).MousePos.y;
    return (bool)(fVar3 < fVar5 + fVar8 & -(fVar6 - fVar8 <= fVar3) & -(fVar2 < fVar7 + fVar1));
  }
  return false;
}

Assistant:

bool ImGui::IsMouseHoveringRect(const ImVec2& r_min, const ImVec2& r_max, bool clip)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindowRead();

    // Clip
    ImRect rect_clipped(r_min, r_max);
    if (clip)
        rect_clipped.ClipWith(window->ClipRect);

    // Expand for touch input
    const ImRect rect_for_touch(rect_clipped.Min - g.Style.TouchExtraPadding, rect_clipped.Max + g.Style.TouchExtraPadding);
    return rect_for_touch.Contains(g.IO.MousePos);
}